

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Char * getContext(XML_Parser parser)

{
  STRING_POOL *pool;
  undefined8 *puVar1;
  undefined1 uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined1 *puVar8;
  XML_Char *pXVar9;
  char *pcVar10;
  undefined8 *puVar11;
  ulong uVar12;
  bool bVar13;
  
  bVar13 = *(long *)((long)parser + 0x398) == 0;
  if (bVar13) {
LAB_0014f194:
    puVar11 = *(undefined8 **)((long)parser + 0x308);
    puVar1 = puVar11 + *(long *)((long)parser + 0x310);
    pool = (STRING_POOL *)((long)parser + 0x418);
    while (puVar11 != puVar1) {
      puVar3 = (undefined8 *)*puVar11;
      puVar11 = puVar11 + 1;
      if ((puVar3 != (undefined8 *)0x0) && (puVar3[1] != 0)) {
        if (!bVar13) {
          puVar8 = *(undefined1 **)((long)parser + 0x430);
          if (puVar8 == *(undefined1 **)((long)parser + 0x428)) {
            iVar6 = poolGrow(pool);
            if (iVar6 == 0) goto LAB_0014f408;
            puVar8 = *(undefined1 **)((long)parser + 0x430);
          }
          *(undefined1 **)((long)parser + 0x430) = puVar8 + 1;
          *puVar8 = 0xc;
        }
        cVar5 = *(char *)*puVar3;
        pcVar4 = (char *)*puVar3;
        while (cVar5 != '\0') {
          pcVar10 = *(char **)((long)parser + 0x430);
          if (pcVar10 == *(char **)((long)parser + 0x428)) {
            iVar6 = poolGrow(pool);
            if (iVar6 == 0) goto LAB_0014f408;
            cVar5 = *pcVar4;
            pcVar10 = *(char **)((long)parser + 0x430);
          }
          *(char **)((long)parser + 0x430) = pcVar10 + 1;
          *pcVar10 = cVar5;
          cVar5 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        }
        puVar8 = *(undefined1 **)((long)parser + 0x430);
        if (puVar8 == *(undefined1 **)((long)parser + 0x428)) {
          iVar6 = poolGrow(pool);
          if (iVar6 == 0) goto LAB_0014f408;
          puVar8 = *(undefined1 **)((long)parser + 0x430);
        }
        *(undefined1 **)((long)parser + 0x430) = puVar8 + 1;
        *puVar8 = 0x3d;
        uVar7 = *(int *)(puVar3[1] + 0x28) + -1 + (uint)(*(char *)((long)parser + 0x488) == '\0');
        bVar13 = false;
        if (0 < (int)uVar7) {
          uVar12 = 0;
          do {
            puVar8 = *(undefined1 **)((long)parser + 0x430);
            if (puVar8 == *(undefined1 **)((long)parser + 0x428)) {
              iVar6 = poolGrow(pool);
              if (iVar6 == 0) goto LAB_0014f408;
              puVar8 = *(undefined1 **)((long)parser + 0x430);
            }
            uVar2 = *(undefined1 *)(*(long *)(puVar3[1] + 0x20) + uVar12);
            *(undefined1 **)((long)parser + 0x430) = puVar8 + 1;
            *puVar8 = uVar2;
            uVar12 = uVar12 + 1;
            bVar13 = false;
          } while (uVar7 != uVar12);
        }
      }
    }
    puVar11 = *(undefined8 **)((long)parser + 0x290);
    puVar1 = puVar11 + *(long *)((long)parser + 0x298);
    while (puVar11 != puVar1) {
      puVar3 = (undefined8 *)*puVar11;
      puVar11 = puVar11 + 1;
      if ((puVar3 != (undefined8 *)0x0) && (*(char *)(puVar3 + 7) != '\0')) {
        if (!bVar13) {
          puVar8 = *(undefined1 **)((long)parser + 0x430);
          if (puVar8 == *(undefined1 **)((long)parser + 0x428)) {
            iVar6 = poolGrow(pool);
            if (iVar6 == 0) goto LAB_0014f408;
            puVar8 = *(undefined1 **)((long)parser + 0x430);
          }
          *(undefined1 **)((long)parser + 0x430) = puVar8 + 1;
          *puVar8 = 0xc;
        }
        cVar5 = *(char *)*puVar3;
        pcVar4 = (char *)*puVar3;
        while (bVar13 = false, cVar5 != '\0') {
          pcVar10 = *(char **)((long)parser + 0x430);
          if (pcVar10 == *(char **)((long)parser + 0x428)) {
            iVar6 = poolGrow(pool);
            if (iVar6 == 0) goto LAB_0014f408;
            cVar5 = *pcVar4;
            pcVar10 = *(char **)((long)parser + 0x430);
          }
          *(char **)((long)parser + 0x430) = pcVar10 + 1;
          *pcVar10 = cVar5;
          cVar5 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        }
      }
    }
    puVar8 = *(undefined1 **)((long)parser + 0x430);
    if (puVar8 == *(undefined1 **)((long)parser + 0x428)) {
      iVar6 = poolGrow(pool);
      if (iVar6 == 0) goto LAB_0014f408;
      puVar8 = *(undefined1 **)((long)parser + 0x430);
    }
    *(undefined1 **)((long)parser + 0x430) = puVar8 + 1;
    *puVar8 = 0;
    pXVar9 = *(XML_Char **)((long)parser + 0x438);
  }
  else {
    puVar8 = *(undefined1 **)((long)parser + 0x430);
    if (puVar8 != *(undefined1 **)((long)parser + 0x428)) {
LAB_0014f11d:
      *(undefined1 **)((long)parser + 0x430) = puVar8 + 1;
      *puVar8 = 0x3d;
      uVar7 = *(int *)(*(long *)((long)parser + 0x398) + 0x28) + -1 +
              (uint)(*(char *)((long)parser + 0x488) == '\0');
      if (0 < (int)uVar7) {
        uVar12 = 0;
        do {
          puVar8 = *(undefined1 **)((long)parser + 0x430);
          if (puVar8 == *(undefined1 **)((long)parser + 0x428)) {
            iVar6 = poolGrow((STRING_POOL *)((long)parser + 0x418));
            if (iVar6 == 0) goto LAB_0014f408;
            puVar8 = *(undefined1 **)((long)parser + 0x430);
          }
          uVar2 = *(undefined1 *)(*(long *)(*(long *)((long)parser + 0x398) + 0x20) + uVar12);
          *(undefined1 **)((long)parser + 0x430) = puVar8 + 1;
          *puVar8 = uVar2;
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      goto LAB_0014f194;
    }
    iVar6 = poolGrow((STRING_POOL *)((long)parser + 0x418));
    if (iVar6 != 0) {
      puVar8 = *(undefined1 **)((long)parser + 0x430);
      goto LAB_0014f11d;
    }
LAB_0014f408:
    pXVar9 = (XML_Char *)0x0;
  }
  return pXVar9;
}

Assistant:

static
const XML_Char *getContext(XML_Parser parser)
{
  HASH_TABLE_ITER iter;
  int needSep = 0;

  if (dtd.defaultPrefix.binding) {
    int i;
    int len;
    if (!poolAppendChar(&tempPool, XML_T('=')))
      return 0;
    len = dtd.defaultPrefix.binding->uriLen;
    if (namespaceSeparator != XML_T('\0'))
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&tempPool, dtd.defaultPrefix.binding->uri[i]))
        return 0;
    needSep = 1;
  }

  hashTableIterInit(&iter, &(dtd.prefixes));
  for (;;) {
    int i;
    int len;
    const XML_Char *s;
    PREFIX *prefix = (PREFIX *)hashTableIterNext(&iter);
    if (!prefix)
      break;
    if (!prefix->binding)
      continue;
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return 0;
    for (s = prefix->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return 0;
    if (!poolAppendChar(&tempPool, XML_T('=')))
      return 0;
    len = prefix->binding->uriLen;
    if (namespaceSeparator != XML_T('\0'))
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&tempPool, prefix->binding->uri[i]))
        return 0;
    needSep = 1;
  }


  hashTableIterInit(&iter, &(dtd.generalEntities));
  for (;;) {
    const XML_Char *s;
    ENTITY *e = (ENTITY *)hashTableIterNext(&iter);
    if (!e)
      break;
    if (!e->open)
      continue;
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return 0;
    for (s = e->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return 0;
    needSep = 1;
  }

  if (!poolAppendChar(&tempPool, XML_T('\0')))
    return 0;
  return tempPool.start;
}